

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O1

Stereo __thiscall nh_ugens::RandomLFO::process(RandomLFO *this)

{
  Stereo SVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (this->m_timeout < 1) {
    this->m_timeout =
         (int)(((((float)(this->m_lcg_state * 0x15a4e35 + 1 >> 0x10) * 0.1) / this->m_frequency) *
               this->m_sample_rate) / 48000.0);
    uVar2 = this->m_lcg_state * 0x7f2856f9 + 0x15a4e36;
    this->m_lcg_state = uVar2;
    this->m_increment =
         (((float)(uVar2 >> 0x10) * 3.051851e-05 + -0.5) * this->m_frequency) / this->m_sample_rate;
  }
  this->m_timeout = this->m_timeout + -1;
  fVar3 = this->m_increment + this->m_phase;
  this->m_phase = fVar3;
  fVar4 = sinf(fVar3);
  fVar3 = this->m_amplitude;
  fVar5 = cosf(this->m_phase);
  SVar1._M_elems[1] = fVar5 * this->m_amplitude;
  SVar1._M_elems[0] = fVar4 * fVar3;
  return (Stereo)SVar1._M_elems;
}

Assistant:

Stereo process(void) {
        if (m_timeout <= 0) {
            m_timeout = run_lcg() * 0.1f / m_frequency * m_sample_rate / 48000.0f;
            m_increment = (run_lcg() * (1.0f / 32767.0f) - 0.5f) * m_frequency / m_sample_rate;
        }
        m_timeout -= 1;
        m_phase += m_increment;
        // TODO: optimize
        Stereo result = {{
            sinf(m_phase) * m_amplitude,
            cosf(m_phase) * m_amplitude
        }};
        return result;
    }